

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

bool __thiscall cs::structure::operator==(structure *this,structure *s)

{
  bool bVar1;
  element_type *args;
  bool *pbVar2;
  any *in_RSI;
  byte *in_RDI;
  iterator iVar3;
  value_type *it;
  const_iterator __end3;
  const_iterator __begin3;
  element_type *__range3;
  string *in_stack_fffffffffffffed8;
  domain_type *in_stack_fffffffffffffee0;
  bool local_d9;
  undefined1 in_stack_ffffffffffffff38 [16];
  allocator local_79;
  string local_78 [43];
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38 [32];
  any *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = type_id::operator!=((type_id *)in_stack_fffffffffffffee0,
                              (type_id *)in_stack_fffffffffffffed8);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    local_3a = 0;
    local_4d = 0;
    local_d9 = false;
    if ((*in_RDI & 1) == 0) {
      std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1f3d8c);
      std::allocator<char>::allocator();
      local_3a = 1;
      std::__cxx11::string::string(local_38,"equal",&local_39);
      local_4d = 1;
      local_d9 = domain_type::exist(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    if ((local_4d & 1) != 0) {
      std::__cxx11::string::~string(local_38);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    if (local_d9 == false) {
      std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffffee0);
      domain_type::begin_abi_cxx11_((domain_type *)0x1f4067);
      iVar3 = (iterator)domain_type::end_abi_cxx11_((domain_type *)0x1f407e);
      while (bVar1 = phmap::priv::operator!=
                               ((const_iterator *)in_stack_fffffffffffffee0,
                                (const_iterator *)in_stack_fffffffffffffed8), bVar1) {
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::const_iterator::operator*((const_iterator *)0x1f40aa);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
        if (bVar1) {
          std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1f40d7);
          in_stack_fffffffffffffee0 =
               (domain_type *)
               domain_type::get_var((domain_type *)iVar3.field_1.slot_,(string *)iVar3.ctrl_);
          std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1f40f7);
          domain_type::get_var_by_id(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
          bVar1 = cs_impl::any::operator!=
                            ((any *)in_stack_fffffffffffffee0,(any *)in_stack_fffffffffffffed8);
          if (bVar1) {
            local_1 = 0;
            goto LAB_001f413e;
          }
        }
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffee0);
      }
      local_1 = 1;
    }
    else {
      args = std::__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::domain_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1f3e39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"equal",&local_79);
      domain_type::get_var(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
      cs_impl::any::make<cs::structure,cs::structure_const*>((structure **)args);
      cs_impl::any::make<cs::structure,cs::structure_const*>((structure **)args);
      invoke<cs_impl::any,cs_impl::any>
                ((var *)__end3.inner_.field_1.slot_,(any *)__end3.inner_.ctrl_,(any *)it);
      pbVar2 = cs_impl::any::const_val<bool>(local_18);
      local_1 = *pbVar2 & 1;
      cs_impl::any::~any((any *)0x1f3f24);
      cs_impl::any::~any((any *)0x1f3f31);
      cs_impl::any::~any((any *)0x1f3f3e);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
  }
LAB_001f413e:
  return (bool)(local_1 & 1);
}

Assistant:

bool operator==(const structure &s) const
		{
			if (s.m_id != m_id)
				return false;
			if (!m_shadow && m_data->exist("equal"))
				return invoke(m_data->get_var("equal"), var::make<structure>(this),
				              var::make<structure>(&s)).const_val<bool>();
			else {
				for (auto &it: *m_data)
					if (it.first != "parent" && s.m_data->get_var(it.first) != m_data->get_var_by_id(it.second))
						return false;
				return true;
			}
		}